

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b-plus-tree.cpp
# Opt level: O1

int __thiscall BPTree::display(BPTree *this,Node *cursor,int nodecount,bool first)

{
  int iVar1;
  ostream *poVar2;
  Node *pNVar3;
  ulong uVar4;
  undefined7 in_register_00000009;
  ulong uVar5;
  long lVar6;
  long lVar7;
  bool bVar8;
  
  if ((int)CONCAT71(in_register_00000009,first) == 0) {
    bVar8 = cursor->IS_LEAF == false;
    if (bVar8) {
      if (-1 < cursor->size) {
        lVar6 = -1;
        do {
          iVar1 = display(this,cursor->ptr[lVar6 + 1],0,false);
          nodecount = nodecount + iVar1;
          lVar6 = lVar6 + 1;
        } while (lVar6 < cursor->size);
      }
      return nodecount + 1;
    }
    if (!bVar8) {
      if (cursor->size < 1) {
        return 1;
      }
      lVar6 = 0;
      lVar7 = 0;
      do {
        poVar2 = std::ostream::_M_insert<double>
                           ((ostream *)&std::cout,
                            (double)*(float *)((long)&cursor->key->key_value + lVar6));
        std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
        lVar7 = lVar7 + 1;
        lVar6 = lVar6 + 0x20;
      } while (lVar7 < cursor->size);
      return 1;
    }
  }
  else {
    uVar4 = (ulong)(uint)cursor->size;
    if (-1 < cursor->size) {
      uVar5 = 0;
      do {
        if (uVar5 != (uVar4 & 0xffffffff)) {
          poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
          poVar2 = std::ostream::_M_insert<double>(poVar2,(double)cursor->key[uVar5].key_value);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
        }
        poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
        pNVar3 = cursor->ptr[uVar5];
        if (0 < pNVar3->size) {
          lVar6 = 0;
          lVar7 = 0;
          do {
            poVar2 = std::ostream::_M_insert<double>
                               ((ostream *)&std::cout,
                                (double)*(float *)((long)&pNVar3->key->key_value + lVar6));
            std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
            lVar7 = lVar7 + 1;
            pNVar3 = cursor->ptr[uVar5];
            lVar6 = lVar6 + 0x20;
          } while (lVar7 < pNVar3->size);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
        uVar4 = (ulong)cursor->size;
        bVar8 = (long)uVar5 < (long)uVar4;
        uVar5 = uVar5 + 1;
      } while (bVar8);
    }
  }
  return 0;
}

Assistant:

int display(Node* cursor, int nodecount, bool first) {
        if (first == true) {
            for (int i = 0;i<cursor->size+1 ; i++){
                if (i!=cursor->size) {
                    cout << 0 << " " << cursor->key[i].key_value << "\n";
                }
                cout << 1 << "\n";
                //cout << cursor->ptr[i]->size << " Size \n";
                for (int j = 0; j<cursor->ptr[i]->size; j++){
                    cout << cursor->ptr[i]->key[j].key_value << " ";
                }
                cout << "\n";
            }
            return 0;
        }
        else {
        int thisnode;
        if (cursor->IS_LEAF == false) {
            for (int i = 0; i < cursor->size + 1; i++) {
                thisnode = display(cursor->ptr[i], 0, false);
                nodecount = nodecount + thisnode;
                //cout<<"\n"<<nodecount<<"\n";

                //read(curr->child_ptr[i]);

            }
            nodecount++;
            return nodecount;
        }
        if (cursor->IS_LEAF == true) {

            for (int i = 0; i < cursor->size; i++) {
                cout << cursor->key[i].key_value << " ";
            }
            return 1;
        }
        return 0;
    }
    }